

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverageClipper.cpp
# Opt level: O1

void countCoverage(string *filename)

{
  int iVar1;
  int iVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  long *plVar8;
  ostream *poVar9;
  runtime_error *this;
  int iVar10;
  BamReader bamreader;
  queue<std::pair<int,_int>,_std::deque<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  positions;
  BamAlignment alignment;
  BamReader local_1e8 [8];
  pair<int,_int> local_1e0;
  _Deque_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_1d8;
  char *local_188;
  long local_180;
  char local_178 [156];
  int local_dc;
  
  BamTools::BamReader::BamReader(local_1e8);
  cVar3 = BamTools::BamReader::Open((string *)local_1e8);
  if (cVar3 == '\0') {
    BamTools::BamReader::GetFilename_abi_cxx11_();
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_188,local_180);
    std::endl<char,std::char_traits<char>>(poVar9);
    if (local_188 != local_178) {
      operator_delete(local_188);
    }
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Couldn\'t open Bamfile");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  BamTools::BamAlignment::BamAlignment((BamAlignment *)&local_188);
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::_M_initialize_map
            (&local_1d8,0);
  bVar4 = true;
  iVar2 = 0;
  do {
    while( true ) {
      iVar10 = iVar2;
      cVar3 = BamTools::BamReader::GetNextAlignment((BamAlignment *)local_1e8);
      iVar2 = local_dc;
      if (cVar3 == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Maximum depth: ",0xf);
        plVar8 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar10);
        std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
        std::ostream::put((char)plVar8);
        std::ostream::flush();
        std::_Deque_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Deque_base
                  (&local_1d8);
        BamTools::BamAlignment::~BamAlignment((BamAlignment *)&local_188);
        BamTools::BamReader::~BamReader(local_1e8);
        return;
      }
      if (!bVar4) break;
      lVar7 = BamTools::BamAlignment::GetEndPosition(SUB81(&local_188,0),false);
      local_1e0 = (pair<int,_int>)((ulong)(iVar2 + 1) | lVar7 << 0x20);
      if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
        _M_push_back_aux<std::pair<int,int>>
                  ((deque<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_1d8,
                   &local_1e0);
      }
      else {
        *local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_1e0;
        local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      bVar4 = false;
      iVar2 = 1;
    }
    iVar5 = BamTools::BamAlignment::GetEndPosition(SUB81(&local_188,0),false);
    do {
      if ((local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
           local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur) ||
         (iVar1 = (local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur)->second, iVar2 < iVar1)
         ) break;
      if (local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur ==
          local_1d8._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
        operator_delete(local_1d8._M_impl.super__Deque_impl_data._M_start._M_first);
        local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_1d8._M_impl.super__Deque_impl_data._M_start._M_node[1];
        local_1d8._M_impl.super__Deque_impl_data._M_start._M_last =
             local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur + 0x40;
        local_1d8._M_impl.super__Deque_impl_data._M_start._M_first =
             local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_1d8._M_impl.super__Deque_impl_data._M_start._M_node =
             local_1d8._M_impl.super__Deque_impl_data._M_start._M_node + 1;
      }
      else {
        local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
      }
    } while (iVar1 <= iVar2);
    local_1e0.second = iVar5;
    local_1e0.first = iVar2 + 1;
    if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
      _M_push_back_aux<std::pair<int,int>>
                ((deque<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_1d8,
                 &local_1e0);
    }
    else {
      *local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_1e0;
      local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
           local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
    }
    uVar6 = ((long)local_1d8._M_impl.super__Deque_impl_data._M_start._M_last -
             (long)local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
            ((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur -
             (long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
            ((((ulong)((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node -
                      (long)local_1d8._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
            (ulong)(local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)
            ) * 0x40;
    iVar2 = (int)uVar6;
    if (uVar6 <= (ulong)(long)iVar10) {
      iVar2 = iVar10;
    }
  } while( true );
}

Assistant:

void countCoverage(string filename) {
    BamTools::BamReader bamreader;
    if (not bamreader.Open(filename)) {
        cerr << bamreader.GetFilename() << endl;
        throw std::runtime_error("Couldn't open Bamfile");
    }
    BamTools::BamAlignment alignment;

    int currentStart =0;
    int currentEnd =0;
    int maxDepth =0;
    std::queue<std::pair<int,int>> positions;
    bool firstAlignment = true;

     while (bamreader.GetNextAlignment(alignment)){

        //Working with the first alignment
        if(firstAlignment){
            positions.push(std::make_pair((alignment.Position+1),alignment.GetEndPosition()));
            maxDepth = 1;
            firstAlignment = false;
            continue;
        }

        //For all alignments other than the first alignment

        //Assigning the positions
        currentStart = (alignment.Position+1);
        currentEnd = alignment.GetEndPosition();

        //cout<<"current start1: "<<currentStartPair1<<" end1: "<<currentEndPair1<<endl;

        while(!positions.empty()){
            //cout<<"start1: "<<firstMatePositions.front().first<<" end1: "<<firstMatePositions.front().second<<endl;
            int endPair1 = positions.front().second;
            if(currentStart>endPair1 ){
                //cout<<"pop"<<endl;
                positions.pop();
                continue;
            }
            break;
        }

        positions.push(std::make_pair(currentStart,currentEnd));

        if((positions.size())>maxDepth){
            maxDepth = positions.size();

        }
    }
     cout<<"Maximum depth: "<<maxDepth<<endl;

}